

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_zmqhub.c
# Opt level: O0

int csp_zmqhub_init(uint16_t addr,char *host,uint32_t flags,csp_iface_t **return_interface)

{
  int iVar1;
  char sub [100];
  char pub [100];
  size_t in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  uint16_t in_stack_ffffffffffffff26;
  undefined4 in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  uint16_t in_stack_ffffffffffffff46;
  
  csp_zmqhub_make_endpoint
            ((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff26,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  csp_zmqhub_make_endpoint
            ((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff26,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  iVar1 = csp_zmqhub_init_w_endpoints
                    (in_stack_ffffffffffffff46,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff2c,
                     (csp_iface_t **)CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20));
  return iVar1;
}

Assistant:

int csp_zmqhub_init(uint16_t addr,
					const char * host,
					uint32_t flags,
					csp_iface_t ** return_interface) {

	char pub[100];
	csp_zmqhub_make_endpoint(host, CSP_ZMQPROXY_SUBSCRIBE_PORT, pub, sizeof(pub));

	char sub[100];
	csp_zmqhub_make_endpoint(host, CSP_ZMQPROXY_PUBLISH_PORT, sub, sizeof(sub));

	return csp_zmqhub_init_w_endpoints(addr, pub, sub, flags, return_interface);
}